

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

string * __thiscall
google::protobuf::FileDescriptor::DebugStringWithOptions_abi_cxx11_
          (string *__return_storage_ptr__,FileDescriptor *this,
          DebugStringOptions *debug_string_options)

{
  _Base_ptr *pp_Var1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  _Rb_tree_header *p_Var3;
  undefined8 *puVar4;
  GoogleOnceDynamic *pGVar5;
  bool bVar6;
  size_t sVar7;
  _Base_ptr p_Var8;
  _Base_ptr p_Var9;
  _Rb_tree_header *p_Var10;
  _Rb_tree_header *p_Var11;
  long lVar12;
  Descriptor *this_00;
  int *piVar13;
  long lVar14;
  long lVar15;
  vector<int,_std::allocator<int>_> path;
  undefined1 local_388 [48];
  vector<int,_std::allocator<int>_> path_1;
  SubstituteArg local_340;
  SubstituteArg local_310;
  SubstituteArg local_2e0;
  set<const_google::protobuf::Descriptor_*,_std::less<const_google::protobuf::Descriptor_*>,_std::allocator<const_google::protobuf::Descriptor_*>_>
  groups;
  _Alloc_hider local_278;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_268;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_258;
  _Alloc_hider local_238;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_228;
  SubstituteArg local_218;
  SubstituteArg local_1e8;
  SubstituteArg local_1b8;
  SubstituteArg local_188;
  set<int,_std::less<int>,_std::allocator<int>_> weak_dependencies;
  SourceLocationCommentPrinter comment_printer;
  set<int,_std::less<int>,_std::allocator<int>_> public_dependencies;
  SubstituteArg local_60;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  path.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  path.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  path.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
            ((vector<int,std::allocator<int>> *)&path,(iterator)0x0,
             &FileDescriptorProto::kSyntaxFieldNumber);
  pp_Var1 = &groups._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  groups._M_t._M_impl._0_8_ = pp_Var1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&groups,"");
  anon_unknown_1::SourceLocationCommentPrinter::SourceLocationCommentPrinter
            (&comment_printer,this,&path,(string *)&groups,debug_string_options);
  if ((_Base_ptr *)groups._M_t._M_impl._0_8_ != pp_Var1) {
    operator_delete((void *)groups._M_t._M_impl._0_8_,
                    (ulong)((long)&(groups._M_t._M_impl.super__Rb_tree_header._M_header._M_parent)->
                                   _M_color + 1));
  }
  anon_unknown_1::SourceLocationCommentPrinter::AddPreComment
            (&comment_printer,__return_storage_ptr__);
  groups._M_t._M_impl._0_8_ = SyntaxName(*(Syntax *)(this + 0x8c));
  sVar7 = strlen((char *)groups._M_t._M_impl._0_8_);
  groups._M_t._M_impl.super__Rb_tree_header._M_header._M_color = (_Rb_tree_color)sVar7;
  public_dependencies._M_t._M_impl._0_8_ = 0;
  public_dependencies._M_t._M_impl.super__Rb_tree_header._M_header._M_color = ~_S_red;
  weak_dependencies._M_t._M_impl._0_8_ = 0;
  weak_dependencies._M_t._M_impl.super__Rb_tree_header._M_header._M_color = ~_S_red;
  local_388._0_8_ = (char *)0x0;
  local_388._8_4_ = -1;
  local_1b8.text_ = (char *)0x0;
  local_1b8.size_ = -1;
  local_1e8.text_ = (char *)0x0;
  local_1e8.size_ = -1;
  local_218.text_ = (char *)0x0;
  local_218.size_ = -1;
  local_2e0.text_ = (char *)0x0;
  local_2e0.size_ = -1;
  local_310.text_ = (char *)0x0;
  local_310.size_ = -1;
  local_340.text_ = (char *)0x0;
  local_340.size_ = -1;
  strings::SubstituteAndAppend
            (__return_storage_ptr__,"syntax = \"$0\";\n\n",(SubstituteArg *)&groups,
             (SubstituteArg *)&public_dependencies,(SubstituteArg *)&weak_dependencies,
             (SubstituteArg *)local_388,&local_1b8,&local_1e8,&local_218,&local_2e0,&local_310,
             &local_340);
  anon_unknown_1::SourceLocationCommentPrinter::AddPostComment
            (&comment_printer,__return_storage_ptr__);
  pp_Var1 = &groups._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)comment_printer.prefix_._M_dataplus._M_p != &comment_printer.prefix_.field_2) {
    operator_delete(comment_printer.prefix_._M_dataplus._M_p,
                    comment_printer.prefix_.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&comment_printer.source_loc_.leading_detached_comments);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)comment_printer.source_loc_.trailing_comments._M_dataplus._M_p !=
      &comment_printer.source_loc_.trailing_comments.field_2) {
    operator_delete(comment_printer.source_loc_.trailing_comments._M_dataplus._M_p,
                    CONCAT71(comment_printer.source_loc_.trailing_comments.field_2.
                             _M_allocated_capacity._1_7_,
                             comment_printer.source_loc_.trailing_comments.field_2._M_local_buf[0])
                    + 1);
  }
  paVar2 = &comment_printer.source_loc_.leading_comments.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)comment_printer.source_loc_.leading_comments._M_dataplus._M_p != paVar2) {
    operator_delete(comment_printer.source_loc_.leading_comments._M_dataplus._M_p,
                    CONCAT71(comment_printer.source_loc_.leading_comments.field_2.
                             _M_allocated_capacity._1_7_,
                             comment_printer.source_loc_.leading_comments.field_2._M_local_buf[0]) +
                    1);
  }
  if (path.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start !=
      (pointer)0x0) {
    operator_delete(path.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)path.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)path.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  groups._M_t._M_impl._0_8_ = pp_Var1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&groups,"");
  comment_printer.source_loc_.leading_comments._M_string_length = 0;
  comment_printer.source_loc_.leading_comments.field_2._M_local_buf[0] = '\0';
  comment_printer.source_loc_.trailing_comments._M_dataplus._M_p =
       (pointer)&comment_printer.source_loc_.trailing_comments.field_2;
  comment_printer.source_loc_.trailing_comments._M_string_length = 0;
  comment_printer.source_loc_.trailing_comments.field_2._M_local_buf[0] = '\0';
  comment_printer.source_loc_.leading_detached_comments.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  comment_printer.source_loc_.leading_detached_comments.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  comment_printer.source_loc_.leading_detached_comments.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  comment_printer.options_.include_comments = debug_string_options->include_comments;
  comment_printer.options_.elide_group_body = debug_string_options->elide_group_body;
  comment_printer.options_.elide_oneof_body = debug_string_options->elide_oneof_body;
  comment_printer.prefix_._M_dataplus._M_p = (pointer)&comment_printer.prefix_.field_2;
  comment_printer.source_loc_.leading_comments._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&comment_printer.prefix_,groups._M_t._M_impl._0_8_,
             CONCAT44(groups._M_t._M_impl.super__Rb_tree_header._M_header._4_4_,
                      groups._M_t._M_impl.super__Rb_tree_header._M_header._M_color) +
             groups._M_t._M_impl._0_8_);
  if (debug_string_options->include_comments == true) {
    comment_printer.have_source_loc_ = GetSourceLocation(this,&comment_printer.source_loc_);
  }
  else {
    comment_printer.have_source_loc_ = false;
  }
  if ((_Base_ptr *)groups._M_t._M_impl._0_8_ != pp_Var1) {
    operator_delete((void *)groups._M_t._M_impl._0_8_,
                    (ulong)((long)&(groups._M_t._M_impl.super__Rb_tree_header._M_header._M_parent)->
                                   _M_color + 1));
  }
  anon_unknown_1::SourceLocationCommentPrinter::AddPreComment
            (&comment_printer,__return_storage_ptr__);
  p_Var3 = &public_dependencies._M_t._M_impl.super__Rb_tree_header;
  public_dependencies._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  public_dependencies._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  public_dependencies._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var3->_M_header;
  public_dependencies._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var3->_M_header;
  public_dependencies._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  weak_dependencies._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &weak_dependencies._M_t._M_impl.super__Rb_tree_header._M_header;
  weak_dependencies._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  weak_dependencies._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  weak_dependencies._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       weak_dependencies._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  weak_dependencies._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  piVar13 = *(int **)(this + 0x40);
  groups._M_t._M_impl._0_8_ = &public_dependencies;
  if ((long)*(int *)(this + 0x38) != 0) {
    lVar12 = (long)*(int *)(this + 0x38) << 2;
    do {
      std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
      _M_insert_unique_<int&,std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::_Alloc_node>
                ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                 &public_dependencies,(const_iterator)p_Var3,piVar13,(_Alloc_node *)&groups);
      piVar13 = piVar13 + 1;
      lVar12 = lVar12 + -4;
    } while (lVar12 != 0);
  }
  piVar13 = *(int **)(this + 0x50);
  groups._M_t._M_impl._0_8_ = &weak_dependencies;
  if ((long)*(int *)(this + 0x48) != 0) {
    lVar12 = (long)*(int *)(this + 0x48) << 2;
    do {
      std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
      _M_insert_unique_<int&,std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::_Alloc_node>
                ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                 &weak_dependencies,
                 (const_iterator)&weak_dependencies._M_t._M_impl.super__Rb_tree_header,piVar13,
                 (_Alloc_node *)&groups);
      piVar13 = piVar13 + 1;
      lVar12 = lVar12 + -4;
    } while (lVar12 != 0);
  }
  if (0 < *(int *)(this + 0x18)) {
    lVar12 = 0;
    p_Var8 = &p_Var3->_M_header;
    p_Var9 = public_dependencies._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    do {
      for (; (_Rb_tree_header *)p_Var9 != (_Rb_tree_header *)0x0;
          p_Var9 = (&p_Var9->_M_left)[(int)*(size_t *)(p_Var9 + 1) < lVar12]) {
        if (lVar12 <= (int)*(size_t *)(p_Var9 + 1)) {
          p_Var8 = p_Var9;
        }
      }
      p_Var11 = p_Var3;
      if (((_Rb_tree_header *)p_Var8 != p_Var3) &&
         (p_Var11 = (_Rb_tree_header *)p_Var8,
         lVar12 < (int)((_Rb_tree_header *)p_Var8)->_M_node_count)) {
        p_Var11 = p_Var3;
      }
      if (p_Var11 == p_Var3) {
        p_Var8 = &weak_dependencies._M_t._M_impl.super__Rb_tree_header._M_header;
        for (p_Var9 = weak_dependencies._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
            (_Rb_tree_header *)p_Var9 != (_Rb_tree_header *)0x0;
            p_Var9 = (&p_Var9->_M_left)[(int)*(size_t *)(p_Var9 + 1) < lVar12]) {
          if (lVar12 <= (int)*(size_t *)(p_Var9 + 1)) {
            p_Var8 = p_Var9;
          }
        }
        p_Var11 = &weak_dependencies._M_t._M_impl.super__Rb_tree_header;
        p_Var10 = p_Var11;
        if (((_Rb_tree_header *)p_Var8 != p_Var11) &&
           (p_Var10 = (_Rb_tree_header *)p_Var8,
           lVar12 < (int)((_Rb_tree_header *)p_Var8)->_M_node_count)) {
          p_Var10 = p_Var11;
        }
        if (p_Var10 == p_Var11) {
          if (*(GoogleOnceDynamic **)(this + 0x30) != (GoogleOnceDynamic *)0x0) {
            GoogleOnceDynamic::Init<google::protobuf::FileDescriptor_const>
                      (*(GoogleOnceDynamic **)(this + 0x30),DependenciesOnceInit,this);
          }
          puVar4 = (undefined8 *)**(long **)(*(long *)(this + 0x20) + lVar12 * 8);
          groups._M_t._M_impl._0_8_ = *puVar4;
          groups._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
               *(_Rb_tree_color *)(puVar4 + 1);
          local_388._0_8_ = (char *)0x0;
          local_388._8_4_ = -1;
          local_1b8.text_ = (char *)0x0;
          local_1b8.size_ = -1;
          local_1e8.text_ = (char *)0x0;
          local_1e8.size_ = -1;
          local_218.text_ = (char *)0x0;
          local_218.size_ = -1;
          local_2e0.text_ = (char *)0x0;
          local_2e0.size_ = -1;
          local_310.text_ = (char *)0x0;
          local_310.size_ = -1;
          local_340.text_ = (char *)0x0;
          local_340.size_ = -1;
          path.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start = (pointer)0x0;
          path.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish = (pointer)CONCAT44(path.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                        super__Vector_impl_data._M_finish._4_4_,0xffffffff);
          local_188.text_ = (char *)0x0;
          local_188.size_ = -1;
          strings::SubstituteAndAppend
                    (__return_storage_ptr__,"import \"$0\";\n",(SubstituteArg *)&groups,
                     (SubstituteArg *)local_388,&local_1b8,&local_1e8,&local_218,&local_2e0,
                     &local_310,&local_340,(SubstituteArg *)&path,&local_188);
        }
        else {
          if (*(GoogleOnceDynamic **)(this + 0x30) != (GoogleOnceDynamic *)0x0) {
            GoogleOnceDynamic::Init<google::protobuf::FileDescriptor_const>
                      (*(GoogleOnceDynamic **)(this + 0x30),DependenciesOnceInit,this);
          }
          puVar4 = (undefined8 *)**(long **)(*(long *)(this + 0x20) + lVar12 * 8);
          groups._M_t._M_impl._0_8_ = *puVar4;
          groups._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
               *(_Rb_tree_color *)(puVar4 + 1);
          local_388._0_8_ = (char *)0x0;
          local_388._8_4_ = -1;
          local_1b8.text_ = (char *)0x0;
          local_1b8.size_ = -1;
          local_1e8.text_ = (char *)0x0;
          local_1e8.size_ = -1;
          local_218.text_ = (char *)0x0;
          local_218.size_ = -1;
          local_2e0.text_ = (char *)0x0;
          local_2e0.size_ = -1;
          local_310.text_ = (char *)0x0;
          local_310.size_ = -1;
          local_340.text_ = (char *)0x0;
          local_340.size_ = -1;
          path.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start = (pointer)0x0;
          path.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish = (pointer)CONCAT44(path.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                        super__Vector_impl_data._M_finish._4_4_,0xffffffff);
          local_188.text_ = (char *)0x0;
          local_188.size_ = -1;
          strings::SubstituteAndAppend
                    (__return_storage_ptr__,"import weak \"$0\";\n",(SubstituteArg *)&groups,
                     (SubstituteArg *)local_388,&local_1b8,&local_1e8,&local_218,&local_2e0,
                     &local_310,&local_340,(SubstituteArg *)&path,&local_188);
        }
      }
      else {
        if (*(GoogleOnceDynamic **)(this + 0x30) != (GoogleOnceDynamic *)0x0) {
          GoogleOnceDynamic::Init<google::protobuf::FileDescriptor_const>
                    (*(GoogleOnceDynamic **)(this + 0x30),DependenciesOnceInit,this);
        }
        puVar4 = (undefined8 *)**(long **)(*(long *)(this + 0x20) + lVar12 * 8);
        groups._M_t._M_impl._0_8_ = *puVar4;
        groups._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
             *(_Rb_tree_color *)(puVar4 + 1);
        local_388._0_8_ = (char *)0x0;
        local_388._8_4_ = -1;
        local_1b8.text_ = (char *)0x0;
        local_1b8.size_ = -1;
        local_1e8.text_ = (char *)0x0;
        local_1e8.size_ = -1;
        local_218.text_ = (char *)0x0;
        local_218.size_ = -1;
        local_2e0.text_ = (char *)0x0;
        local_2e0.size_ = -1;
        local_310.text_ = (char *)0x0;
        local_310.size_ = -1;
        local_340.text_ = (char *)0x0;
        local_340.size_ = -1;
        path.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
             = (pointer)0x0;
        path.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
             = (pointer)CONCAT44(path.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_finish._4_4_,0xffffffff);
        local_188.text_ = (char *)0x0;
        local_188.size_ = -1;
        strings::SubstituteAndAppend
                  (__return_storage_ptr__,"import public \"$0\";\n",(SubstituteArg *)&groups,
                   (SubstituteArg *)local_388,&local_1b8,&local_1e8,&local_218,&local_2e0,&local_310
                   ,&local_340,(SubstituteArg *)&path,&local_188);
      }
      lVar12 = lVar12 + 1;
      p_Var8 = &p_Var3->_M_header;
      p_Var9 = public_dependencies._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    } while (lVar12 < *(int *)(this + 0x18));
  }
  if (*(long *)(*(long *)(this + 8) + 8) != 0) {
    path_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
         (pointer)0x0;
    path_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
         (pointer)0x0;
    path_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
              ((vector<int,std::allocator<int>> *)&path_1,(iterator)0x0,
               &FileDescriptorProto::kPackageFieldNumber);
    local_388._0_8_ = local_388 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_388,"");
    anon_unknown_1::SourceLocationCommentPrinter::SourceLocationCommentPrinter
              ((SourceLocationCommentPrinter *)&groups,this,&path_1,(string *)local_388,
               debug_string_options);
    if ((undefined1 *)local_388._0_8_ != local_388 + 0x10) {
      operator_delete((void *)local_388._0_8_,local_388._16_8_ + 1);
    }
    anon_unknown_1::SourceLocationCommentPrinter::AddPreComment
              ((SourceLocationCommentPrinter *)&groups,__return_storage_ptr__);
    local_388._0_8_ = **(undefined8 **)(this + 8);
    local_388._8_4_ = *(undefined4 *)(*(undefined8 **)(this + 8) + 1);
    local_1b8.text_ = (char *)0x0;
    local_1b8.size_ = -1;
    local_1e8.text_ = (char *)0x0;
    local_1e8.size_ = -1;
    local_218.text_ = (char *)0x0;
    local_218.size_ = -1;
    local_2e0.text_ = (char *)0x0;
    local_2e0.size_ = -1;
    local_310.text_ = (char *)0x0;
    local_310.size_ = -1;
    local_340.text_ = (char *)0x0;
    local_340.size_ = -1;
    path.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
         (pointer)0x0;
    path.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
         (pointer)CONCAT44(path.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_finish._4_4_,0xffffffff);
    local_188.text_ = (char *)0x0;
    local_188.size_ = -1;
    local_60.text_ = (char *)0x0;
    local_60.size_ = -1;
    strings::SubstituteAndAppend
              (__return_storage_ptr__,"package $0;\n\n",(SubstituteArg *)local_388,&local_1b8,
               &local_1e8,&local_218,&local_2e0,&local_310,&local_340,(SubstituteArg *)&path,
               &local_188,&local_60);
    anon_unknown_1::SourceLocationCommentPrinter::AddPostComment
              ((SourceLocationCommentPrinter *)&groups,__return_storage_ptr__);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238._M_p != &local_228) {
      operator_delete(local_238._M_p,local_228._M_allocated_capacity + 1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_258);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_278._M_p != &local_268) {
      operator_delete(local_278._M_p,local_268._M_allocated_capacity + 1);
    }
    if (groups._M_t._M_impl.super__Rb_tree_header._M_header._M_left !=
        (_Base_ptr)&groups._M_t._M_impl.super__Rb_tree_header._M_node_count) {
      operator_delete(groups._M_t._M_impl.super__Rb_tree_header._M_header._M_left,
                      groups._M_t._M_impl.super__Rb_tree_header._M_node_count + 1);
    }
    if (path_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(path_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)path_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)path_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
  }
  bVar6 = anon_unknown_1::FormatLineOptions
                    (0,*(Message **)(this + 0xa0),*(DescriptorPool **)(this + 0x10),
                     __return_storage_ptr__);
  if (bVar6) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  if (0 < *(int *)(this + 0x68)) {
    lVar12 = 0;
    lVar15 = 0;
    do {
      EnumDescriptor::DebugString
                ((EnumDescriptor *)(*(long *)(this + 0x70) + lVar12),0,__return_storage_ptr__,
                 debug_string_options);
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      lVar15 = lVar15 + 1;
      lVar12 = lVar12 + 0x38;
    } while (lVar15 < *(int *)(this + 0x68));
  }
  p_Var3 = &groups._M_t._M_impl.super__Rb_tree_header;
  groups._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  groups._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  groups._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  groups._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var3->_M_header;
  groups._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var3->_M_header;
  if (0 < *(int *)(this + 0x88)) {
    lVar12 = 0;
    lVar15 = 0;
    do {
      lVar14 = *(long *)(this + 0x98);
      pGVar5 = *(GoogleOnceDynamic **)(lVar14 + 0x40 + lVar12);
      if (pGVar5 != (GoogleOnceDynamic *)0x0) {
        GoogleOnceDynamic::Init<google::protobuf::FieldDescriptor_const>
                  (pGVar5,FieldDescriptor::TypeOnceInit,(FieldDescriptor *)(lVar12 + lVar14));
      }
      if (*(int *)(lVar14 + 0x48 + lVar12) == 10) {
        lVar14 = *(long *)(this + 0x98);
        pGVar5 = *(GoogleOnceDynamic **)(lVar14 + 0x40 + lVar12);
        if (pGVar5 != (GoogleOnceDynamic *)0x0) {
          GoogleOnceDynamic::Init<google::protobuf::FieldDescriptor_const>
                    (pGVar5,FieldDescriptor::TypeOnceInit,(FieldDescriptor *)(lVar12 + lVar14));
        }
        local_388._0_8_ = *(undefined8 *)(lVar14 + 0x70 + lVar12);
        std::
        _Rb_tree<google::protobuf::Descriptor_const*,google::protobuf::Descriptor_const*,std::_Identity<google::protobuf::Descriptor_const*>,std::less<google::protobuf::Descriptor_const*>,std::allocator<google::protobuf::Descriptor_const*>>
        ::_M_insert_unique<google::protobuf::Descriptor_const*>
                  ((_Rb_tree<google::protobuf::Descriptor_const*,google::protobuf::Descriptor_const*,std::_Identity<google::protobuf::Descriptor_const*>,std::less<google::protobuf::Descriptor_const*>,std::allocator<google::protobuf::Descriptor_const*>>
                    *)&groups,(Descriptor **)local_388);
      }
      lVar15 = lVar15 + 1;
      lVar12 = lVar12 + 0xa8;
    } while (lVar15 < *(int *)(this + 0x88));
  }
  if (0 < *(int *)(this + 0x58)) {
    lVar12 = 0;
    do {
      this_00 = (Descriptor *)(lVar12 * 0xa8 + *(long *)(this + 0x60));
      p_Var9 = &p_Var3->_M_header;
      for (p_Var8 = groups._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
          (_Rb_tree_header *)p_Var8 != (_Rb_tree_header *)0x0;
          p_Var8 = (&p_Var8->_M_left)[*(Descriptor **)(p_Var8 + 1) < this_00]) {
        if (*(Descriptor **)(p_Var8 + 1) >= this_00) {
          p_Var9 = p_Var8;
        }
      }
      p_Var11 = p_Var3;
      if (((_Rb_tree_header *)p_Var9 != p_Var3) &&
         (p_Var11 = (_Rb_tree_header *)p_Var9,
         this_00 < (Descriptor *)((_Rb_tree_header *)p_Var9)->_M_node_count)) {
        p_Var11 = p_Var3;
      }
      if (p_Var11 == p_Var3) {
        Descriptor::DebugString(this_00,0,__return_storage_ptr__,debug_string_options,true);
        std::__cxx11::string::append((char *)__return_storage_ptr__);
      }
      lVar12 = lVar12 + 1;
    } while (lVar12 < *(int *)(this + 0x58));
  }
  if (0 < *(int *)(this + 0x78)) {
    lVar12 = 0;
    lVar15 = 0;
    do {
      ServiceDescriptor::DebugString
                ((ServiceDescriptor *)(*(long *)(this + 0x80) + lVar12),__return_storage_ptr__,
                 debug_string_options);
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      lVar15 = lVar15 + 1;
      lVar12 = lVar12 + 0x30;
    } while (lVar15 < *(int *)(this + 0x78));
  }
  if (0 < *(int *)(this + 0x88)) {
    lVar15 = 0;
    lVar14 = 0;
    lVar12 = 0;
    do {
      if (*(long *)(*(long *)(this + 0x98) + 0x58 + lVar15) != lVar12) {
        if (lVar15 != 0) {
          std::__cxx11::string::append((char *)__return_storage_ptr__);
        }
        lVar12 = *(long *)(*(long *)(this + 0x98) + 0x58 + lVar15);
        local_388._0_8_ = **(undefined8 **)(lVar12 + 8);
        local_388._8_4_ = *(undefined4 *)(*(undefined8 **)(lVar12 + 8) + 1);
        local_1b8.text_ = (char *)0x0;
        local_1b8.size_ = -1;
        local_1e8.text_ = (char *)0x0;
        local_1e8.size_ = -1;
        local_218.text_ = (char *)0x0;
        local_218.size_ = -1;
        local_2e0.text_ = (char *)0x0;
        local_2e0.size_ = -1;
        local_310.text_ = (char *)0x0;
        local_310.size_ = -1;
        local_340.text_ = (char *)0x0;
        local_340.size_ = -1;
        path.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
             = (pointer)0x0;
        path.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
             = (pointer)CONCAT44(path.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_finish._4_4_,0xffffffff);
        local_188.text_ = (char *)0x0;
        local_188.size_ = -1;
        local_60.text_ = (char *)0x0;
        local_60.size_ = -1;
        strings::SubstituteAndAppend
                  (__return_storage_ptr__,"extend .$0 {\n",(SubstituteArg *)local_388,&local_1b8,
                   &local_1e8,&local_218,&local_2e0,&local_310,&local_340,(SubstituteArg *)&path,
                   &local_188,&local_60);
      }
      FieldDescriptor::DebugString
                ((FieldDescriptor *)(*(long *)(this + 0x98) + lVar15),1,PRINT_LABEL,
                 __return_storage_ptr__,debug_string_options);
      lVar14 = lVar14 + 1;
      lVar15 = lVar15 + 0xa8;
    } while (lVar14 < *(int *)(this + 0x88));
    if (0 < *(int *)(this + 0x88)) {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
  }
  anon_unknown_1::SourceLocationCommentPrinter::AddPostComment
            (&comment_printer,__return_storage_ptr__);
  std::
  _Rb_tree<const_google::protobuf::Descriptor_*,_const_google::protobuf::Descriptor_*,_std::_Identity<const_google::protobuf::Descriptor_*>,_std::less<const_google::protobuf::Descriptor_*>,_std::allocator<const_google::protobuf::Descriptor_*>_>
  ::~_Rb_tree(&groups._M_t);
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            (&weak_dependencies._M_t);
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            (&public_dependencies._M_t);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)comment_printer.prefix_._M_dataplus._M_p != &comment_printer.prefix_.field_2) {
    operator_delete(comment_printer.prefix_._M_dataplus._M_p,
                    comment_printer.prefix_.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&comment_printer.source_loc_.leading_detached_comments);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)comment_printer.source_loc_.trailing_comments._M_dataplus._M_p !=
      &comment_printer.source_loc_.trailing_comments.field_2) {
    operator_delete(comment_printer.source_loc_.trailing_comments._M_dataplus._M_p,
                    CONCAT71(comment_printer.source_loc_.trailing_comments.field_2.
                             _M_allocated_capacity._1_7_,
                             comment_printer.source_loc_.trailing_comments.field_2._M_local_buf[0])
                    + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)comment_printer.source_loc_.leading_comments._M_dataplus._M_p !=
      &comment_printer.source_loc_.leading_comments.field_2) {
    operator_delete(comment_printer.source_loc_.leading_comments._M_dataplus._M_p,
                    CONCAT71(comment_printer.source_loc_.leading_comments.field_2.
                             _M_allocated_capacity._1_7_,
                             comment_printer.source_loc_.leading_comments.field_2._M_local_buf[0]) +
                    1);
  }
  return __return_storage_ptr__;
}

Assistant:

string FileDescriptor::DebugStringWithOptions(
    const DebugStringOptions& debug_string_options) const {
  string contents;
  {
    std::vector<int> path;
    path.push_back(FileDescriptorProto::kSyntaxFieldNumber);
    SourceLocationCommentPrinter syntax_comment(
        this, path, "", debug_string_options);
    syntax_comment.AddPreComment(&contents);
    strings::SubstituteAndAppend(&contents, "syntax = \"$0\";\n\n",
                                 SyntaxName(syntax()));
    syntax_comment.AddPostComment(&contents);
  }

  SourceLocationCommentPrinter
      comment_printer(this, "", debug_string_options);
  comment_printer.AddPreComment(&contents);

  std::set<int> public_dependencies;
  std::set<int> weak_dependencies;
  public_dependencies.insert(public_dependencies_,
                             public_dependencies_ + public_dependency_count_);
  weak_dependencies.insert(weak_dependencies_,
                           weak_dependencies_ + weak_dependency_count_);

  for (int i = 0; i < dependency_count(); i++) {
    if (public_dependencies.count(i) > 0) {
      strings::SubstituteAndAppend(&contents, "import public \"$0\";\n",
                                   dependency(i)->name());
    } else if (weak_dependencies.count(i) > 0) {
      strings::SubstituteAndAppend(&contents, "import weak \"$0\";\n",
                                   dependency(i)->name());
    } else {
      strings::SubstituteAndAppend(&contents, "import \"$0\";\n",
                                   dependency(i)->name());
    }
  }

  if (!package().empty()) {
    std::vector<int> path;
    path.push_back(FileDescriptorProto::kPackageFieldNumber);
    SourceLocationCommentPrinter package_comment(
        this, path, "", debug_string_options);
    package_comment.AddPreComment(&contents);
    strings::SubstituteAndAppend(&contents, "package $0;\n\n", package());
    package_comment.AddPostComment(&contents);
  }

  if (FormatLineOptions(0, options(), pool(), &contents)) {
    contents.append("\n");  // add some space if we had options
  }

  for (int i = 0; i < enum_type_count(); i++) {
    enum_type(i)->DebugString(0, &contents, debug_string_options);
    contents.append("\n");
  }

  // Find all the 'group' type extensions; we will not output their nested
  // definitions (those will be done with their group field descriptor).
  std::set<const Descriptor*> groups;
  for (int i = 0; i < extension_count(); i++) {
    if (extension(i)->type() == FieldDescriptor::TYPE_GROUP) {
      groups.insert(extension(i)->message_type());
    }
  }

  for (int i = 0; i < message_type_count(); i++) {
    if (groups.count(message_type(i)) == 0) {
      message_type(i)->DebugString(0, &contents, debug_string_options,
                                   /* include_opening_clause */ true);
      contents.append("\n");
    }
  }

  for (int i = 0; i < service_count(); i++) {
    service(i)->DebugString(&contents, debug_string_options);
    contents.append("\n");
  }

  const Descriptor* containing_type = NULL;
  for (int i = 0; i < extension_count(); i++) {
    if (extension(i)->containing_type() != containing_type) {
      if (i > 0) contents.append("}\n\n");
      containing_type = extension(i)->containing_type();
      strings::SubstituteAndAppend(&contents, "extend .$0 {\n",
                                   containing_type->full_name());
    }
    extension(i)->DebugString(1, FieldDescriptor::PRINT_LABEL, &contents,
                              debug_string_options);
  }
  if (extension_count() > 0) contents.append("}\n\n");

  comment_printer.AddPostComment(&contents);

  return contents;
}